

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O0

string * UrlDecode_abi_cxx11_(string_view url_encoded)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_pointer pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_int> _Var5;
  char *p;
  char c;
  size_t i;
  string *res;
  uint decoded_value;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  char in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  int __base;
  undefined4 in_stack_ffffffffffffff70;
  errc in_stack_ffffffffffffff74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *__first;
  ulong local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff60);
  std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (size_type)in_stack_ffffffffffffff78);
  local_48 = 0;
  do {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff48);
    if (sVar2 <= local_48) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_ffffffffffffff58,
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    if ((*pvVar3 == '%') &&
       (sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          (in_stack_ffffffffffffff48), local_48 + 2 < sVar2)) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         (in_stack_ffffffffffffff48);
      __base = (int)((ulong)(pvVar4 + local_48 + 1) >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff48);
      _Var5 = std::from_chars<unsigned_int>
                        ((char *)__first,(char *)in_stack_ffffffffffffff78,
                         (uint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         __base);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var5.ptr;
      in_stack_ffffffffffffff74 = _Var5.ec;
      in_stack_ffffffffffffff78 = this;
      if ((in_stack_ffffffffffffff74 != 0) ||
         (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                             (in_stack_ffffffffffffff48), in_stack_ffffffffffffff58 = this,
         this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pvVar4 + local_48 + 3))) goto LAB_00db03cc;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,in_stack_ffffffffffffff57);
      local_48 = local_48 + 2;
    }
    else {
LAB_00db03cc:
      this = in_stack_ffffffffffffff58;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,in_stack_ffffffffffffff57);
    }
    local_48 = local_48 + 1;
    in_stack_ffffffffffffff58 = this;
  } while( true );
}

Assistant:

std::string UrlDecode(std::string_view url_encoded)
{
    std::string res;
    res.reserve(url_encoded.size());

    for (size_t i = 0; i < url_encoded.size(); ++i) {
        char c = url_encoded[i];
        // Special handling for percent which should be followed by two hex digits
        // representing an octet values, see RFC 3986, Section 2.1 Percent-Encoding
        if (c == '%' && i + 2 < url_encoded.size()) {
            unsigned int decoded_value{0};
            auto [p, ec] = std::from_chars(url_encoded.data() + i + 1, url_encoded.data() + i + 3, decoded_value, 16);

            // Only if there is no error and the pointer is set to the end of
            // the string, we can be sure both characters were valid hex
            if (ec == std::errc{} && p == url_encoded.data() + i + 3) {
                res += static_cast<char>(decoded_value);
                // Next two characters are part of the percent encoding
                i += 2;
                continue;
            }
            // In case of invalid percent encoding, add the '%' and continue
        }
        res += c;
    }

    return res;
}